

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall BigNum::BigNum(BigNum *this,string *input)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  int local_30;
  int local_2c;
  
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->sign = true;
  iVar2 = (int)*(input->_M_dataplus)._M_p;
  if (9 < iVar2 - 0x30U && iVar2 != 0x2d) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Numbers cannot contain character");
    poVar3 = std::operator<<(poVar3,*(input->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  uVar5 = 1;
  while( true ) {
    pcVar1 = (input->_M_dataplus)._M_p;
    uVar4 = input->_M_string_length;
    if (uVar4 <= uVar5) break;
    if (9 < (int)pcVar1[uVar5] - 0x30U) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Numbers cannot contain character");
      poVar3 = std::operator<<(poVar3,(input->_M_dataplus)._M_p[uVar5]);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar5 = uVar5 + 1;
  }
  if (*pcVar1 == '-') {
    this->sign = false;
    uVar4 = uVar4 & 0xffffffff;
    while( true ) {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 1) break;
      local_2c = (input->_M_dataplus)._M_p[(uint)uVar4 & 0x7fffffff] + -0x30;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->digits,&local_2c);
    }
  }
  else {
    uVar4 = uVar4 & 0xffffffff;
    while( true ) {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 0) break;
      local_30 = (input->_M_dataplus)._M_p[(uint)uVar4 & 0x7fffffff] + -0x30;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->digits,&local_30);
    }
  }
  this->length = (int)((ulong)((long)(this->digits).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->digits).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

BigNum(string input) {
        if (!isdigit(input[0]) && input[0] != '-') {
            cout << "Numbers cannot contain character" << input[0] << endl;
        }
        for (int i = 1; i < input.size(); i++){
            if (!isdigit(input[i]))
                cout << "Numbers cannot contain character" << input[i] << endl;
        }
        if (input[0] == '-') {
            sign = false;
            for (int i = input.size() - 1; i > 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        } else {
            for (int i = input.size() - 1; i >= 0; i--)
                digits.push_back(input[i] - '0');
            length = digits.size();
        }
    }